

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simplex_tree_ctor_and_move_unit_test.cpp
# Opt level: O1

void print_simplex_filtration<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_default>>
               (Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_default> *st,string *msg)

{
  pair<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_default>_>_>
  *ppVar1;
  undefined8 uVar2;
  undefined2 uVar3;
  ostream *poVar4;
  Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_default> *pSVar5;
  Filtration_value *__x;
  short vertex;
  short sVar6;
  pointer pvVar7;
  anon_class_1_0_00000001 local_89;
  undefined1 local_88 [32];
  Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_default> *local_68;
  pointer local_60;
  pointer local_58;
  Simplex_handle local_50;
  vector<int,_std::allocator<int>_> local_48;
  
  local_88._0_8_ = st;
  Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_default>::
  initialize_filtration<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_default>::is_before_in_totally_ordered_filtration,Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_default>::initialize_filtration(bool)const::_lambda(boost::container::vec_iterator<std::pair<short,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_default>>>*,true>)_2_>
            (st,(is_before_in_totally_ordered_filtration *)local_88,&local_89);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::clog,
             "********************************************************************\n",0x45);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::clog,"* ",2);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::clog,(msg->_M_dataplus)._M_p,msg->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::clog,"* The complex contains ",0x17);
  Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_default>::num_simplices
            (st,&st->root_);
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)&std::clog);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4," simplices",10);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::clog,"   - dimension ",0xf);
  if (st->dimension_to_be_lowered_ == true) {
    Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_default>::
    lower_upper_bound_dimension(st);
  }
  poVar4 = (ostream *)std::ostream::operator<<(&std::clog,st->dimension_);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::clog,
             "* Iterator on Simplices in the filtration, with [filtration value]:\n",0x44);
  if ((st->filtration_vect_).
      super__Vector_base<boost::container::vec_iterator<std::pair<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_default>_>_>_*,_true>,_std::allocator<boost::container::vec_iterator<std::pair<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_default>_>_>_*,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      (st->filtration_vect_).
      super__Vector_base<boost::container::vec_iterator<std::pair<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_default>_>_>_*,_true>,_std::allocator<boost::container::vec_iterator<std::pair<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_default>_>_>_*,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    local_88._0_8_ = st;
    Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_default>::
    initialize_filtration<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_default>::is_before_in_totally_ordered_filtration,Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_default>::initialize_filtration(bool)const::_lambda(boost::container::vec_iterator<std::pair<short,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_default>>>*,true>)_2_>
              (st,(is_before_in_totally_ordered_filtration *)local_88,&local_89);
  }
  pvVar7 = (st->filtration_vect_).
           super__Vector_base<boost::container::vec_iterator<std::pair<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_default>_>_>_*,_true>,_std::allocator<boost::container::vec_iterator<std::pair<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_default>_>_>_*,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_60 = (st->filtration_vect_).
             super__Vector_base<boost::container::vec_iterator<std::pair<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_default>_>_>_*,_true>,_std::allocator<boost::container::vec_iterator<std::pair<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_default>_>_>_*,_true>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  local_68 = st;
  if (pvVar7 != local_60) {
    do {
      pSVar5 = local_68;
      ppVar1 = pvVar7->m_ptr;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::clog,"   ",3);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::clog,"[",1);
      __x = (Filtration_value *)&ppVar1->second;
      if (ppVar1 == (pair<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_default>_>_>
                     *)0x0) {
        __x = &Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_default>::
               Filtration_simplex_base_real::inf_;
      }
      std::vector<int,_std::allocator<int>_>::vector
                (&local_48,&__x->super_vector<int,_std::allocator<int>_>);
      print_filtration_value_abi_cxx11_((string *)local_88,&local_48);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::clog,(char *)local_88._0_8_,
                          CONCAT62(local_88._10_6_,local_88._8_2_));
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"] ",2);
      if ((Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_default> *)local_88._0_8_ !=
          (Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_default> *)(local_88 + 0x10))
      {
        operator_delete((void *)local_88._0_8_,(ulong)(local_88._16_8_ + 1));
      }
      local_58 = pvVar7;
      if (local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer)0x0) {
        operator_delete(local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      local_50.m_ptr = ppVar1;
      Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_default>::
      simplex_vertex_range((Simplex_vertex_range *)local_88,pSVar5,&local_50);
      uVar3 = local_88._24_2_;
      uVar2 = local_88._16_8_;
      pSVar5 = (Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_default> *)local_88._0_8_
      ;
      sVar6 = local_88._8_2_;
      if (local_88._8_2_ != local_88._24_2_ || local_88._0_8_ != local_88._16_8_) {
        do {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::clog,"(",1);
          poVar4 = (ostream *)std::ostream::operator<<(&std::clog,sVar6);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4,")",1);
          sVar6 = (short)(pSVar5->nodes_label_to_list_)._M_h._M_bucket_count;
          pSVar5 = (Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_default> *)
                   (pSVar5->nodes_label_to_list_)._M_h._M_buckets;
        } while (sVar6 != uVar3 ||
                 pSVar5 != (Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_default> *)
                           uVar2);
      }
      std::ios::widen((char)*(undefined8 *)(std::clog + -0x18) + '@');
      std::ostream::put('@');
      std::ostream::flush();
      pvVar7 = local_58 + 1;
    } while (pvVar7 != local_60);
  }
  return;
}

Assistant:

void print_simplex_filtration(const Simplex_tree& st, const std::string& msg) {
  // Required before browsing through filtration values
  st.initialize_filtration();

  std::clog << "********************************************************************\n";
  std::clog << "* " << msg << "\n";
  std::clog << "* The complex contains " << st.num_simplices() << " simplices";
  std::clog << "   - dimension " << st.dimension() << "\n";
  std::clog << "* Iterator on Simplices in the filtration, with [filtration value]:\n";
  for (auto f_simplex : st.filtration_simplex_range()) {
    std::clog << "   "
              << "[" << print_filtration_value(st.filtration(f_simplex)) << "] ";
    for (auto vertex : st.simplex_vertex_range(f_simplex)) std::clog << "(" << vertex << ")";
    std::clog << std::endl;
  }

}